

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

Maybe<kj::Exception> * __thiscall
kj::runCatchingExceptions<kj::_::TransformPromiseNodeBase::get(kj::_::ExceptionOrValue&)::__0>
          (Maybe<kj::Exception> *__return_storage_ptr__,kj *this,anon_class_16_2_4cebe8fc *func)

{
  anon_class_16_2_4cebe8fc *func_local;
  
  _::TransformPromiseNodeBase::get::anon_class_16_2_4cebe8fc::operator()
            ((anon_class_16_2_4cebe8fc *)this);
  Maybe<kj::Exception>::Maybe(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Maybe<Exception> runCatchingExceptions(Func&& func) {
  try {
    func();
    return kj::none;
  } catch (...) {
    return getCaughtExceptionAsKj();
  }
}